

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testSampleImages.cpp
# Opt level: O2

void testSampleImages(string *param_1)

{
  char cVar1;
  ostream *poVar2;
  int i;
  int iVar3;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Testing sample image files");
  std::endl<char,std::char_traits<char>>(poVar2);
  anon_unknown.dwarf_276681::readImage
            ("/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/comp_none.exr"
             ,0x619c);
  anon_unknown.dwarf_276681::readImage
            ("/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/comp_rle.exr"
             ,0x619c);
  anon_unknown.dwarf_276681::readImage
            ("/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/comp_zips.exr"
             ,0x619c);
  anon_unknown.dwarf_276681::readImage
            ("/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/comp_zip.exr"
             ,0x619c);
  anon_unknown.dwarf_276681::readImage
            ("/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/comp_piz.exr"
             ,0x619c);
  for (iVar3 = 0; iVar3 != 5; iVar3 = iVar3 + 1) {
    cVar1 = IlmThread_3_4::supportsThreads();
    if (cVar1 != '\0') {
      Imf_3_4::setGlobalThreadCount(iVar3);
      anon_unknown.dwarf_276681::readImage
                ("/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/lineOrder_increasing.exr"
                 ,0xb5b3);
      anon_unknown.dwarf_276681::readImage
                ("/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/lineOrder_decreasing.exr"
                 ,0xb5b3);
    }
  }
  anon_unknown.dwarf_276681::compareImages
            ("/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/comp_b44.exr"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/comp_b44_piz.exr"
            );
  anon_unknown.dwarf_276681::compareImages
            ("/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/comp_dwaa_v1.exr"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/comp_dwaa_piz.exr"
            );
  anon_unknown.dwarf_276681::compareImages
            ("/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/comp_dwaa_v2.exr"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/comp_dwaa_piz.exr"
            );
  anon_unknown.dwarf_276681::compareImages
            ("/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/comp_dwab_v1.exr"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/comp_dwab_piz.exr"
            );
  anon_unknown.dwarf_276681::compareImages
            ("/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/comp_dwab_v2.exr"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/comp_dwab_piz.exr"
            );
  poVar2 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void
testSampleImages (const std::string&)
{
    try
    {
        cout << "Testing sample image files" << endl;

        readImage (ILM_IMF_TEST_IMAGEDIR "comp_none.exr", 24988);
        readImage (ILM_IMF_TEST_IMAGEDIR "comp_rle.exr", 24988);
        readImage (ILM_IMF_TEST_IMAGEDIR "comp_zips.exr", 24988);
        readImage (ILM_IMF_TEST_IMAGEDIR "comp_zip.exr", 24988);
        readImage (ILM_IMF_TEST_IMAGEDIR "comp_piz.exr", 24988);

        for (int i = 0; i < 5; i++)
        {
            if (ILMTHREAD_NAMESPACE::supportsThreads ())
            {
                setGlobalThreadCount (i);

                readImage (
                    ILM_IMF_TEST_IMAGEDIR "lineOrder_increasing.exr", 46515);

                readImage (
                    ILM_IMF_TEST_IMAGEDIR "lineOrder_decreasing.exr", 46515);
            }
        }

        compareImages (
            ILM_IMF_TEST_IMAGEDIR "comp_b44.exr",
            ILM_IMF_TEST_IMAGEDIR "comp_b44_piz.exr");

        compareImages (
            ILM_IMF_TEST_IMAGEDIR "comp_dwaa_v1.exr",
            ILM_IMF_TEST_IMAGEDIR "comp_dwaa_piz.exr");
        compareImages (
            ILM_IMF_TEST_IMAGEDIR "comp_dwaa_v2.exr",
            ILM_IMF_TEST_IMAGEDIR "comp_dwaa_piz.exr");

        compareImages (
            ILM_IMF_TEST_IMAGEDIR "comp_dwab_v1.exr",
            ILM_IMF_TEST_IMAGEDIR "comp_dwab_piz.exr");
        compareImages (
            ILM_IMF_TEST_IMAGEDIR "comp_dwab_v2.exr",
            ILM_IMF_TEST_IMAGEDIR "comp_dwab_piz.exr");

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}